

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  ulong uVar3;
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  int local_29c;
  undefined1 local_298 [8];
  string code;
  undefined1 local_270 [12];
  undefined1 local_260 [12];
  undefined1 local_250 [8];
  string content;
  istream_type local_220 [8];
  ifstream ifs;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ybb language interpreter V0.1");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    do {
      std::__cxx11::string::string((string *)local_298);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)local_298);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        runProgram((string *)local_298);
        local_29c = 0;
      }
      else {
        local_29c = 3;
      }
      std::__cxx11::string::~string((string *)local_298);
    } while (local_29c == 0);
  }
  else {
    std::ifstream::ifstream(local_220,argv[1],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"File not found.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    else {
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_260,local_220);
      std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
                ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_270);
      std::allocator<char>::allocator();
      __beg._12_4_ = 0;
      __beg._M_sbuf = (streambuf_type *)local_260._0_8_;
      __beg._M_c = local_260._8_4_;
      __end._12_4_ = 0;
      __end._M_sbuf = (streambuf_type *)local_270._0_8_;
      __end._M_c = local_270._8_4_;
      std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
                ((string *)local_250,__beg,__end,
                 (allocator<char> *)(code.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf));
      runProgram((string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
    }
    std::ifstream::~ifstream(local_220);
  }
  return 0;
}

Assistant:

int main(int argc, const char*argv[]) {
    if (argc >= 2){
        std::ifstream ifs(argv[1]);
        if (ifs.is_open()) {
            std::string content((std::istreambuf_iterator<char>(ifs)),
                                (std::istreambuf_iterator<char>()));
            runProgram(content);
        } else{
            std::cout << "File not found." << std::endl;
        }
        return 0;
    }

    std::cout << "Ybb language interpreter V0.1" << std::endl;
    while (true){
        std::string code;
        getline(std::cin, code);
        if (code.empty())
            break;

        runProgram(code);
    }
    return 0;
}